

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall
om::concurrency::queue<std::function<void_()>_>::enqueue
          (queue<std::function<void_()>_> *this,function<void_()> *item_)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  function<void_()> *item__local;
  queue<std::function<void_()>_> *this_local;
  
  lock._M_device = (mutex_type *)item_;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mutex);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push(&this->_queue,item_);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void enqueue(T item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);
				_queue.push(std::move(item_));
				_condition.notify_one();
			}